

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

ssize_t __thiscall
ft::list<int,_ft::allocator<int>_>::splice
          (list<int,_ft::allocator<int>_> *this,int __fdin,__off64_t *__offin,int __fdout,
          __off64_t *__offout,size_t __len,uint __flags)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_RAX;
  undefined4 in_register_00000034;
  
  if ((this != (list<int,_ft::allocator<int>_> *)__offin) && (in_RAX = __offin[2], in_RAX != 0)) {
    lVar1 = *(long *)(*__offin + 0x10);
    lVar2 = *(long *)(__offin[1] + 8);
    lVar3 = *(long *)(lVar2 + 0x10);
    lVar4 = *(long *)(lVar1 + 8);
    *(long *)(lVar4 + 0x10) = lVar3;
    *(long *)(lVar3 + 8) = lVar4;
    lVar3 = *(long *)(CONCAT44(in_register_00000034,__fdin) + 8);
    lVar4 = *(long *)(lVar3 + 8);
    *(long *)(lVar4 + 0x10) = lVar1;
    *(long *)(lVar1 + 8) = lVar4;
    *(long *)(lVar3 + 8) = lVar2;
    *(long *)(lVar2 + 0x10) = lVar3;
    this->m_size = this->m_size + in_RAX;
    __offin[2] = 0;
  }
  return in_RAX;
}

Assistant:

void splice(iterator position, list & x) {
		if (this != &x && !x.empty()) {
			node*	first = x.head()->next;
			node*	last = x.tail()->prev;
			this->unlinkNodes(first, last);
			this->linkNodes(position.node(), first, last);
			this->m_size += x.size();
			x.m_size = 0;
		}
	}